

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void bsPutUInt32(EState *s,UInt32 u)

{
  uint in_ESI;
  EState *in_RDI;
  
  bsW(in_RDI,8,in_ESI >> 0x18);
  bsW(in_RDI,8,in_ESI >> 0x10 & 0xff);
  bsW(in_RDI,8,in_ESI >> 8 & 0xff);
  bsW(in_RDI,8,in_ESI & 0xff);
  return;
}

Assistant:

static
void bsPutUInt32 ( EState* s, UInt32 u )
{
   bsW ( s, 8, (u >> 24) & 0xffL );
   bsW ( s, 8, (u >> 16) & 0xffL );
   bsW ( s, 8, (u >>  8) & 0xffL );
   bsW ( s, 8,  u        & 0xffL );
}